

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<short,false,std::allocator<unsigned_long>>::
indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<short,false,std::allocator<unsigned_long>> *this,size_t index,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          outit)

{
  size_t sVar1;
  size_t sVar2;
  size_t j;
  ulong j_00;
  
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
  sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(sVar1 != 0);
  marray_detail::Assert<bool>(index < *(ulong *)(this + 0x30));
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
  if (*(int *)(this + 0x38) == 0) {
    j_00 = 0;
    while( true ) {
      sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
      if (sVar1 <= j_00) break;
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_00);
      outit._M_current[j_00] = index / sVar1;
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_00);
      index = index % sVar1;
      j_00 = j_00 + 1;
    }
  }
  else {
    sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
    while( true ) {
      sVar1 = sVar1 - 1;
      sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar1);
      outit._M_current[sVar1] = index / sVar2;
      sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar1);
      if (sVar1 == 0) break;
      index = index % sVar2;
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::indexToCoordinates
(
    std::size_t index, // copy to work on
    CoordinateIterator outit
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || this->dimension() > 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size());
    if(coordinateOrder() == FirstMajorOrder) {
        for(std::size_t j=0; j<this->dimension(); ++j, ++outit) {
            *outit = std::size_t(index / geometry_.shapeStrides(j));
            index = index % geometry_.shapeStrides(j);
        }
    }
    else { // last major order
        std::size_t j = this->dimension()-1;
        outit += j;
        for(;;) {
            *outit = std::size_t(index / geometry_.shapeStrides(j));
            index = index % geometry_.shapeStrides(j);
            if(j == 0) {
                break;
            }
            else {
                --outit;
                --j;
            }
        }
    }
}